

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

GLvoid __thiscall
glcts::anon_unknown_0::GatherBase::CreateTexture2DR(GatherBase *this,bool base_level)

{
  CallLogWrapper *this_00;
  uint level;
  undefined7 in_register_00000031;
  int iVar1;
  uint uVar2;
  int level_00;
  allocator_type local_51;
  uint local_50;
  value_type_conflict2 local_4c;
  GLfloat data [4];
  
  local_50 = (uint)CONCAT71(in_register_00000031,base_level);
  iVar1 = local_50 * 0x20;
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->tex);
  level_00 = 0;
  for (uVar2 = iVar1 + 0x20; uVar2 != 0; uVar2 = uVar2 >> 1) {
    local_4c = 1.0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)data,(ulong)(uVar2 * uVar2),&local_4c,
               &local_51);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,level_00,0x822e,uVar2,uVar2,0,0x1903,0x1406,(void *)data._0_8_);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)data);
    level_00 = level_00 + 1;
  }
  data[0] = 0.75;
  data[1] = 0.5;
  data[2] = 0.0;
  data[3] = 0.25;
  uVar2 = local_50 & 0xff;
  level = local_50 & 0xff;
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,0xde1,uVar2,0x16,0x19,2,2,0x1903,0x1406,
             (_Vector_base<float,_std::allocator<float>_> *)data);
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,0xde1,level,0x10,10,1,1,0x1903,0x1406,
             (_Vector_base<float,_std::allocator<float>_> *)data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar2,0xb,2,1,1,0x1903,0x1406,data + 1);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar2,0x18,0xd,1,1,0x1903,0x1406,data + 2);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar2,9,0xe,1,1,0x1903,0x1406,data + 3);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2700);
  return;
}

Assistant:

virtual GLvoid CreateTexture2DR(bool base_level = false)
	{
		GLenum		internal_format = GL_R32F;
		GLenum		format			= GL_RED;
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= GL_FLOAT;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			std::vector<GLfloat> pixels(size * size, 1.0);
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, &pixels[0]);
		}

		GLfloat data[4] = { 12. / 16., 8. / 16., 0. / 16., 4. / 16. };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, tex_type, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, tex_type, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, tex_type, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, tex_type, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, tex_type, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}
	}